

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

Header * anon_unknown.dwarf_13f597::writefile(FrameBuffer *buf,char **channels,PixelType *pt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  Header *in_RDI;
  OutputFile f;
  int width;
  int height;
  Header *hdr;
  ChannelList *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  OutputFile local_88 [39];
  undefined1 in_stack_ffffffffffffff9f;
  FrameBuffer *in_stack_ffffffffffffffa0;
  PixelType *in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  Vec2<float> local_34;
  byte local_29;
  int local_28;
  int local_24;
  
  std::numeric_limits<int>::max();
  local_24 = random_int(in_stack_fffffffffffffe64);
  local_24 = local_24 / 2;
  std::numeric_limits<int>::max();
  iVar2 = random_int(in_stack_fffffffffffffe64);
  iVar3 = local_24;
  local_29 = 0;
  local_28 = iVar2 / 2;
  Imath_3_2::Vec2<float>::Vec2(&local_34,0.0,0.0);
  Imf_3_4::Header::Header
            (in_RDI,iVar2 / 2,iVar3,1.0,(Vec2 *)&local_34,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::numeric_limits<int>::max();
  iVar3 = random_int(in_stack_fffffffffffffe64);
  if (iVar3 < 0) {
    iVar3 = iVar3 + 3;
  }
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  *piVar4 = iVar3 >> 2;
  std::numeric_limits<int>::max();
  iVar3 = random_int(in_stack_fffffffffffffe64);
  if (iVar3 < 0) {
    iVar3 = iVar3 + 3;
  }
  lVar5 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar5 + 4) = iVar3 >> 2;
  iVar3 = random_int(in_stack_fffffffffffffe64);
  if (iVar3 != 0) {
    piVar4 = (int *)Imf_3_4::Header::dataWindow();
    iVar3 = *piVar4;
    piVar4 = (int *)Imf_3_4::Header::dataWindow();
    *piVar4 = -iVar3;
  }
  iVar3 = random_int(in_stack_fffffffffffffe64);
  if (iVar3 != 0) {
    lVar5 = Imf_3_4::Header::dataWindow();
    iVar3 = *(int *)(lVar5 + 4);
    lVar5 = Imf_3_4::Header::dataWindow();
    *(int *)(lVar5 + 4) = -iVar3;
  }
  lVar5 = Imf_3_4::Header::dataWindow();
  iVar3 = *(int *)(lVar5 + 4);
  iVar2 = random_int(in_stack_fffffffffffffe64);
  lVar5 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar5 + 0xc) = iVar3 + 1 + iVar2;
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  iVar3 = *piVar4;
  lVar5 = Imf_3_4::Header::dataWindow();
  iVar2 = *(int *)(lVar5 + 0xc);
  lVar5 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar5 + 4);
  lVar5 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar5 + 8) =
       iVar3 + SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x33333)) / SEXT816((long)iVar2 - (long)iVar1),0
                     );
  iVar3 = random_int(in_stack_fffffffffffffe64);
  piVar4 = (int *)Imf_3_4::Header::compression();
  *piVar4 = iVar3;
  setupBuffer(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::operator=
            ((ChannelList *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  Imf_3_4::ChannelList::~ChannelList((ChannelList *)0x1ae6ab);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  remove(pcVar6);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(local_88,pcVar6,in_RDI,iVar3);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_88);
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::OutputFile::writePixels((int)local_88);
  local_29 = 1;
  Imf_3_4::OutputFile::~OutputFile(local_88);
  if ((local_29 & 1) == 0) {
    Imf_3_4::Header::~Header(in_RDI);
  }
  return in_RDI;
}

Assistant:

Header
writefile (
    FrameBuffer&       buf,
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt)
{

    const int height = random_int () / 2;
    const int width  = random_int () / 2;

    Header hdr (width, height, 1);

    //
    // set min origin to be anything up to half INT_MAX
    //
    hdr.dataWindow ().min.x = random_int () / 4;
    hdr.dataWindow ().min.y = random_int () / 4;
    if (random_int (2)) { hdr.dataWindow ().min.x = -hdr.dataWindow ().min.x; }
    if (random_int (2)) { hdr.dataWindow ().min.y = -hdr.dataWindow ().min.y; }

    //
    // up to 512 scanlines
    //
    hdr.dataWindow ().max.y = hdr.dataWindow ().min.y + random_int (512) + 1;

    //
    // compute image width to give us at most 'pixelCount' pixels in the image
    //
    hdr.dataWindow ().max.x =
        hdr.dataWindow ().min.x +
        pixelCount / ((long long) (hdr.dataWindow ().max.y) -
                      (long long) (hdr.dataWindow ().min.y));

    hdr.compression () =
        Compression (random_int (static_cast<int> (NUM_COMPRESSION_METHODS)));
    hdr.channels () = setupBuffer (hdr, channels, pt, buf, true);

    remove (filename.c_str ());
    OutputFile f (filename.c_str (), hdr);
    f.setFrameBuffer (buf);
    f.writePixels (hdr.dataWindow ().max.y - hdr.dataWindow ().min.y + 1);

    return hdr;
}